

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::inf_or_nan_writer>
          (basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
           *this,align_spec *spec,inf_or_nan_writer *f)

{
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
  bVar1;
  ulong uVar2;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
  *pbVar3;
  char __tmp;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
  bVar4;
  ulong uVar5;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
  bVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  
  uVar12 = (ulong)spec->width_;
  uVar10 = 4 - (ulong)(f->sign == '\0');
  uVar8 = uVar10 - uVar12;
  if (uVar12 <= uVar10) {
LAB_001fd5e1:
    inf_or_nan_writer::operator()
              ((inf_or_nan_writer *)f,
               (truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *)this);
    return;
  }
  bVar1 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
            *)&spec->fill_;
  uVar7 = uVar12 - uVar10;
  if (spec->align_ == ALIGN_CENTER) {
    uVar9 = uVar7 >> 1;
    pbVar3 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
               **)this;
    uVar2 = *(ulong *)(this + 8);
    uVar8 = *(ulong *)(this + 0x10);
    bVar4 = this[0x18];
    uVar5 = uVar9;
    bVar6 = bVar4;
    if (1 < uVar7) {
      do {
        bVar4 = bVar1;
        if (uVar8 < uVar2) {
          *pbVar3 = bVar1;
          bVar4 = bVar6;
        }
        pbVar3 = pbVar3 + (uVar8 < uVar2);
        uVar8 = uVar8 + 1;
        uVar5 = uVar5 - 1;
        bVar6 = bVar4;
      } while (uVar5 != 0);
    }
    *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
      **)this = pbVar3;
    *(ulong *)(this + 8) = uVar2;
    *(ulong *)(this + 0x10) = uVar8;
    this[0x18] = bVar4;
    inf_or_nan_writer::operator()
              ((inf_or_nan_writer *)f,
               (truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *)this);
    pbVar3 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
               **)this;
    uVar2 = *(ulong *)(this + 8);
    uVar8 = *(ulong *)(this + 0x10);
    bVar4 = this[0x18];
    if (uVar7 != uVar9) {
      lVar11 = (uVar10 + uVar9) - uVar12;
      bVar6 = bVar4;
      do {
        bVar4 = bVar1;
        if (uVar8 < uVar2) {
          *pbVar3 = bVar1;
          bVar4 = bVar6;
        }
        pbVar3 = pbVar3 + (uVar8 < uVar2);
        uVar8 = uVar8 + 1;
        lVar11 = lVar11 + 1;
        bVar6 = bVar4;
      } while (lVar11 != 0);
    }
    *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
      **)this = pbVar3;
    *(ulong *)(this + 8) = uVar2;
    *(ulong *)(this + 0x10) = uVar8;
    this[0x18] = bVar4;
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      pbVar3 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
                 **)this;
      uVar2 = *(ulong *)(this + 8);
      uVar8 = *(ulong *)(this + 0x10);
      bVar4 = this[0x18];
      if (uVar7 != 0) {
        lVar11 = uVar10 - uVar12;
        bVar6 = bVar4;
        do {
          bVar4 = bVar1;
          if (uVar8 < uVar2) {
            *pbVar3 = bVar1;
            bVar4 = bVar6;
          }
          pbVar3 = pbVar3 + (uVar8 < uVar2);
          uVar8 = uVar8 + 1;
          lVar11 = lVar11 + 1;
          bVar6 = bVar4;
        } while (lVar11 != 0);
      }
      *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
        **)this = pbVar3;
      *(ulong *)(this + 8) = uVar2;
      *(ulong *)(this + 0x10) = uVar8;
      this[0x18] = bVar4;
      goto LAB_001fd5e1;
    }
    inf_or_nan_writer::operator()
              ((inf_or_nan_writer *)f,
               (truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *)this);
    pbVar3 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
               **)this;
    uVar12 = *(ulong *)(this + 8);
    uVar10 = *(ulong *)(this + 0x10);
    bVar4 = this[0x18];
    while (uVar7 != 0) {
      bVar6 = bVar1;
      if (uVar10 < uVar12) {
        *pbVar3 = bVar1;
        bVar6 = bVar4;
      }
      pbVar3 = pbVar3 + (uVar10 < uVar12);
      uVar10 = uVar10 + 1;
      uVar8 = uVar8 + 1;
      bVar4 = bVar6;
      uVar7 = uVar8;
    }
    *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
      **)this = pbVar3;
    *(ulong *)(this + 8) = uVar12;
    *(ulong *)(this + 0x10) = uVar10;
    this[0x18] = bVar4;
  }
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }